

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

stringpiece_ssize_type google::protobuf::StringPiece::CheckedSsizeTFromSizeT(size_t size)

{
  ulong uVar1;
  size_t size_local;
  
  uVar1 = std::numeric_limits<long>::max();
  if (uVar1 < size) {
    LogFatalSizeTooBig(size,"size_t to int conversion");
  }
  return size;
}

Assistant:

static stringpiece_ssize_type CheckedSsizeTFromSizeT(size_t size) {
#if STRINGPIECE_CHECK_SIZE > 0
#ifdef max
#undef max
#endif
    if (size > static_cast<size_t>(
        std::numeric_limits<stringpiece_ssize_type>::max())) {
      // Some people grep for this message in logs
      // so take care if you ever change it.
      LogFatalSizeTooBig(size, "size_t to int conversion");
    }
#endif
    return static_cast<stringpiece_ssize_type>(size);
  }